

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::HeapArgumentsObject::SetProperty
          (HeapArgumentsObject *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  uint uVar1;
  BOOL BVar2;
  uint32 uVar3;
  int iVar4;
  uint local_44;
  ScriptContext *pSStack_40;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  HeapArgumentsObject *pHStack_18;
  PropertyId propertyId_local;
  HeapArgumentsObject *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local._4_4_ = propertyId;
  pHStack_18 = this;
  pSStack_40 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar2 = ScriptContext::IsNumericPropertyId(pSStack_40,value_local._4_4_,&local_44);
  uVar1 = local_44;
  if (((BVar2 == 0) || (uVar3 = GetNumberOfArguments(this), uVar3 <= uVar1)) ||
     (iVar4 = (*(this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(this,(ulong)local_44,pvStack_28), iVar4 == 0)) {
    this_local._4_4_ =
         DynamicObject::SetProperty
                   ((DynamicObject *)this,value_local._4_4_,pvStack_28,info_local._4_4_,
                    (PropertyValueInfo *)scriptContext);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL HeapArgumentsObject::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        // Try to set a numbered property that maps to an actual argument.
        ScriptContext *scriptContext = GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            if (this->SetItemAt(index, value))
            {
                return true;
            }
        }

        // TODO: In strict mode, "callee" and "caller" cannot be set.

        // length is also set in the dynamic object
        return DynamicObject::SetProperty(propertyId, value, flags, info);
    }